

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.cpp
# Opt level: O0

void __thiscall CBuildVisitor::Visit(CBuildVisitor *this,CAssignSubscriptStm *statement)

{
  int _value;
  pointer pCVar1;
  pointer pIVar2;
  pointer pIVar3;
  CStatementWrapper *this_00;
  CMoveStatement *this_01;
  CMemExpression *this_02;
  CBinopExpression *this_03;
  CBinopExpression *this_04;
  CBinopExpression *this_05;
  CConstExpression *pCVar4;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_e0;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_d0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_c8;
  undefined1 local_b9;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_b0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a8;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_a0;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_98;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_90;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_88;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_80;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_78;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_70;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_68;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_60;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_58;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_50;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
  rightPartExpression;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> indexExpression;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_28;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_20;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
  leftPartExpression;
  CAssignSubscriptStm *statement_local;
  CBuildVisitor *this_local;
  
  leftPartExpression._M_t.
  super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
  super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
        )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )statement;
  std::operator<<((ostream *)&std::cout,"IRT builder: CAssignSubscriptStm\n");
  pCVar1 = std::unique_ptr<CIdExp,_std::default_delete<CIdExp>_>::operator->
                     ((unique_ptr<CIdExp,_std::default_delete<CIdExp>_> *)
                      ((long)leftPartExpression._M_t.
                             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                      0x18));
  (**(pCVar1->super_IExpression).super_PositionedNode.super_INode._vptr_INode)(pCVar1,this);
  pIVar2 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&this->wrapper);
  (**pIVar2->_vptr_ISubtreeWrapper)();
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_20,&local_28);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_28);
  pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                      ((long)leftPartExpression._M_t.
                             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                      0x20));
  (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  pIVar2 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&this->wrapper);
  (**pIVar2->_vptr_ISubtreeWrapper)(&rightPartExpression);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_40,&rightPartExpression);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&rightPartExpression);
  pIVar3 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                     ((unique_ptr<IExpression,_std::default_delete<IExpression>_> *)
                      ((long)leftPartExpression._M_t.
                             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
                             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl +
                      0x28));
  (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
  pIVar2 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->(&this->wrapper);
  (**pIVar2->_vptr_ISubtreeWrapper)(&local_58);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_50,&local_58);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_58);
  this_00 = (CStatementWrapper *)operator_new(0x10);
  this_01 = (CMoveStatement *)operator_new(0x18);
  this_02 = (CMemExpression *)operator_new(0x10);
  local_d3 = 1;
  this_03 = (CBinopExpression *)operator_new(0x20);
  local_d2 = 1;
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_80,&local_20);
  this_04 = (CBinopExpression *)operator_new(0x20);
  local_d1 = 1;
  this_05 = (CBinopExpression *)operator_new(0x20);
  local_b9 = 1;
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_a8,&local_40);
  pCVar4 = (CConstExpression *)operator_new(0x10);
  IRT::CConstExpression::CConstExpression(pCVar4,1);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_b8,(pointer)pCVar4);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_b0,&local_b8);
  IRT::CBinopExpression::CBinopExpression(this_05,&local_a8,&local_b0,PLUS);
  local_b9 = 0;
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_a0,(pointer)this_05);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_98,&local_a0);
  pCVar4 = (CConstExpression *)operator_new(0x10);
  _value = IRT::CFrame::GetWordSize(this->currentFrame);
  IRT::CConstExpression::CConstExpression(pCVar4,_value);
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_d0,(pointer)pCVar4);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_c8,&local_d0);
  IRT::CBinopExpression::CBinopExpression(this_04,&local_98,&local_c8,MULTYPLY);
  local_d1 = 0;
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_90,(pointer)this_04);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_88,&local_90);
  IRT::CBinopExpression::CBinopExpression(this_03,&local_80,&local_88,PLUS);
  local_d2 = 0;
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_78,(pointer)this_03);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_70,&local_78);
  IRT::CMemExpression::CMemExpression(this_02,&local_70);
  local_d3 = 0;
  std::unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>>::
  unique_ptr<std::default_delete<IRT::CExpression_const>,void>
            ((unique_ptr<IRT::CExpression_const,std::default_delete<IRT::CExpression_const>> *)
             &local_68,(pointer)this_02);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_60,&local_68);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_e0,&local_50);
  IRT::CMoveStatement::CMoveStatement(this_01,&local_60,&local_e0);
  IRT::CStatementWrapper::CStatementWrapper(this_00,(CStatement *)this_01);
  updateSubtreeWrapper(this,(ISubtreeWrapper *)this_00);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_e0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_60);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_68);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_70);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_78);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_88);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_90);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_c8);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_d0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_98);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_a0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_b0);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_b8);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_a8);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_80);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_50);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_40);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_20);
  return;
}

Assistant:

void CBuildVisitor::Visit( CAssignSubscriptStm &statement ) {
    std::cout << "IRT builder: CAssignSubscriptStm\n";
    statement.idExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> leftPartExpression = std::move( wrapper->ToExpression( ));

    statement.indexExpression->Accept(*this);
    std::unique_ptr<const IRT::CExpression> indexExpression = std::move( wrapper->ToExpression() );

    statement.valueExpression->Accept( *this );
    std::unique_ptr<const IRT::CExpression> rightPartExpression = std::move( wrapper->ToExpression( ));


    updateSubtreeWrapper( new IRT::CStatementWrapper(
            new IRT::CMoveStatement(
                    std::move( std::unique_ptr<const IRT::CExpression>(
                            new IRT::CMemExpression(
                                    std::move( std::unique_ptr<const IRT::CExpression>( new IRT::CBinopExpression(
                                            std::move( leftPartExpression ),
                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                    new IRT::CBinopExpression(
                                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                                    new IRT::CBinopExpression(
                                                                            std::move( indexExpression ),
                                                                            std::move(
                                                                                    std::unique_ptr<const IRT::CExpression>(
                                                                                            new IRT::CConstExpression(
                                                                                                    1 )
                                                                                    )),
                                                                            IRT::enums::TOperationType::PLUS
                                                                    ))),
                                                            std::move( std::unique_ptr<const IRT::CExpression>(
                                                                    new IRT::CConstExpression(
                                                                            currentFrame->GetWordSize( )))),
                                                            IRT::enums::TOperationType::MULTYPLY
                                                    )
                                            )),
                                            IRT::enums::TOperationType::PLUS
                                                                                        )
                                               )
                                    )))),
                    std::move( rightPartExpression )
            )
    ));

}